

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_reader.h
# Opt level: O1

void MyGame_Example_Any_sort(MyGame_Example_Any_mutable_union_t u)

{
  float fVar1;
  undefined4 uVar2;
  int iVar3;
  undefined8 uVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  MyGame_Example_Monster_mutable_table_t pMVar8;
  uint uVar9;
  ulong uVar10;
  ushort uVar11;
  int iVar12;
  MyGame_Example_Monster_mutable_table_t pMVar13;
  MyGame_Example_Monster_mutable_table_t pMVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  MyGame_Example_Monster_mutable_table_t pMVar19;
  MyGame_Example_Monster_mutable_table_t pMVar20;
  size_t sVar21;
  bool bVar22;
  float x__tmp;
  MyGame_Example_Any_mutable_union_t u_00;
  
  pMVar8 = (MyGame_Example_Monster_mutable_table_t)u.value;
  if (u.type == '\x04') {
    if (pMVar8 != (MyGame_Example_Monster_mutable_table_t)0x0) {
      lVar6 = -(long)*(int *)pMVar8;
      if (*(ushort *)(pMVar8 + -(long)*(int *)pMVar8) < 10) {
        uVar11 = 0;
      }
      else {
        uVar11 = *(ushort *)(pMVar8 + lVar6 + 8);
      }
      if (uVar11 == 0) {
        pMVar19 = (MyGame_Example_Monster_mutable_table_t)0x0;
      }
      else {
        pMVar19 = pMVar8 + (ulong)*(uint *)(pMVar8 + uVar11) + (ulong)uVar11 + 4;
      }
      if (*(ushort *)(pMVar8 + -(long)*(int *)pMVar8) < 0xc) {
        uVar11 = 0;
      }
      else {
        uVar11 = *(ushort *)(pMVar8 + lVar6 + 10);
      }
      if (uVar11 == 0) {
        pMVar20 = (MyGame_Example_Monster_mutable_table_t)0x0;
      }
      else {
        pMVar20 = pMVar8 + (ulong)*(uint *)(pMVar8 + uVar11) + (ulong)uVar11 + 4;
      }
      if (pMVar19 == (MyGame_Example_Monster_mutable_table_t)0x0) {
        uVar5 = 0;
      }
      else {
        uVar5 = *(uint *)(pMVar19 + -4);
      }
      if (pMVar20 == (MyGame_Example_Monster_mutable_table_t)0x0) {
        uVar9 = 0;
      }
      else {
        uVar9 = *(uint *)(pMVar20 + -4);
      }
      if (uVar5 != uVar9) {
        __assert_fail("flatbuffers_vec_len(uv__tmp.type) == flatbuffers_vec_len(uv__tmp.value) && \"union vector type length mismatch\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O1/test/monster_test/generated/monster_test_reader.h"
                      ,0x3d8,
                      "MyGame_Example_Any_union_vec_t MyGame_Example_Alt_manyany_union(MyGame_Example_Alt_table_t)"
                     );
      }
      if (pMVar19 == (MyGame_Example_Monster_mutable_table_t)0x0) {
        uVar10 = 0;
      }
      else {
        uVar10 = (ulong)*(uint *)(pMVar19 + -4);
      }
      if (uVar10 != 0) {
        uVar18 = 0;
        pMVar13 = pMVar20;
        do {
          if (pMVar19 == (MyGame_Example_Monster_mutable_table_t)0x0) {
            uVar7 = 0;
          }
          else {
            uVar7 = (ulong)*(uint *)(pMVar19 + -4);
          }
          if (uVar7 <= uVar18) {
            __assert_fail("n__tmp > (i__tmp) && \"index out of range\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O1/test/monster_test/generated/monster_test_reader.h"
                          ,0x386,
                          "MyGame_Example_Any_union_t MyGame_Example_Any_union_vec_at(MyGame_Example_Any_union_vec_t, size_t)"
                         );
          }
          if (pMVar19[uVar18].unused__ == 0) {
            pMVar14 = (MyGame_Example_Monster_mutable_table_t)0x0;
          }
          else {
            if (pMVar20 == (MyGame_Example_Monster_mutable_table_t)0x0) {
              uVar7 = 0;
            }
            else {
              uVar7 = (ulong)*(uint *)(pMVar20 + -4);
            }
            if (uVar7 <= uVar18) {
              __assert_fail("flatbuffers_vec_len(vec) > (i) && \"index out of range\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O1/test/monster_test/generated/flatbuffers_common_reader.h"
                            ,0x93,
                            "flatbuffers_generic_t flatbuffers_generic_vec_at(flatbuffers_generic_vec_t, size_t)"
                           );
            }
            pMVar14 = pMVar13 + *(uint *)pMVar13;
          }
          u_00._1_7_ = 0;
          u_00.type = pMVar19[uVar18].unused__;
          u_00.value = pMVar14;
          MyGame_Example_Any_sort(u_00);
          uVar18 = uVar18 + 1;
          pMVar13 = pMVar13 + 4;
        } while (uVar10 != uVar18);
      }
      if (*(ushort *)(pMVar8 + -(long)*(int *)pMVar8) < 0xe) {
        uVar11 = 0;
      }
      else {
        uVar11 = *(ushort *)(pMVar8 + (0xc - (long)*(int *)pMVar8));
      }
      if (uVar11 == 0) {
        pMVar19 = (MyGame_Example_Monster_mutable_table_t)0x0;
      }
      else {
        pMVar19 = pMVar8 + (ulong)*(uint *)(pMVar8 + uVar11) + (ulong)uVar11 + 4;
      }
      if (pMVar19 != (MyGame_Example_Monster_mutable_table_t)0x0) {
        uVar5 = *(uint *)(pMVar19 + -4);
        uVar10 = (ulong)uVar5;
        if (uVar10 != 0) {
          uVar18 = (ulong)(uVar5 >> 1);
          do {
            __MyGame_Example_MultipleKeys_sort_by_foobar__heap_sift_down
                      ((MyGame_Example_MultipleKeys_mutable_vec_t)pMVar19,uVar18,uVar10 - 1);
            bVar22 = uVar18 != 0;
            uVar18 = uVar18 - 1;
          } while (bVar22);
          if (uVar10 - 1 != 0) {
            sVar21 = uVar10 - 2;
            iVar12 = uVar5 * -4;
            iVar17 = uVar5 * 4;
            do {
              iVar17 = iVar17 + -4;
              iVar12 = iVar12 + 4;
              iVar3 = *(int *)pMVar19;
              *(int *)pMVar19 = *(int *)(pMVar19 + sVar21 * 4 + 4) + iVar17;
              *(int *)(pMVar19 + sVar21 * 4 + 4) = iVar3 + iVar12;
              __MyGame_Example_MultipleKeys_sort_by_foobar__heap_sift_down
                        ((MyGame_Example_MultipleKeys_mutable_vec_t)pMVar19,0,sVar21);
              bVar22 = sVar21 != 0;
              sVar21 = sVar21 - 1;
            } while (bVar22);
          }
        }
      }
      if (*(ushort *)(pMVar8 + -(long)*(int *)pMVar8) < 0x10) {
        uVar11 = 0;
      }
      else {
        uVar11 = *(ushort *)(pMVar8 + (0xe - (long)*(int *)pMVar8));
      }
      if (uVar11 == 0) {
        pMVar19 = (MyGame_Example_Monster_mutable_table_t)0x0;
      }
      else {
        pMVar19 = pMVar8 + (ulong)*(uint *)(pMVar8 + uVar11) + (ulong)uVar11 + 4;
      }
      if (pMVar19 != (MyGame_Example_Monster_mutable_table_t)0x0) {
        uVar5 = *(uint *)(pMVar19 + -4);
        if ((ulong)uVar5 != 0) {
          uVar10 = (ulong)uVar5 - 1;
          uVar18 = (ulong)(uVar5 >> 1);
          uVar7 = uVar18;
joined_r0x00113f14:
          do {
            uVar15 = uVar18 * 2;
            if (uVar15 <= uVar10) {
              if (uVar15 < uVar10) {
                if ((*(uint *)(pMVar19 + -4) <= uVar15) ||
                   (uVar16 = uVar15 | 1, *(uint *)(pMVar19 + -4) <= uVar16)) {
LAB_0011425f:
                  __assert_fail("flatbuffers_vec_len(vec) > (i) && \"index out of range\"",
                                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O1/test/monster_test/generated/monster_test_reader.h"
                                ,0x2f5,
                                "Fantasy_Rapunzel_struct_t Fantasy_Rapunzel_vec_at(Fantasy_Rapunzel_vec_t, size_t)"
                               );
                }
                if (*(ushort *)(pMVar19 + uVar16 * 8) <= *(ushort *)(pMVar19 + (uVar18 << 4)))
                goto LAB_00113f4a;
              }
              else {
LAB_00113f4a:
                uVar16 = uVar15;
              }
              if ((*(uint *)(pMVar19 + -4) <= uVar18) || (*(uint *)(pMVar19 + -4) <= uVar16))
              goto LAB_0011425f;
              if (*(ushort *)(pMVar19 + uVar18 * 8) < *(ushort *)(pMVar19 + uVar16 * 8)) {
                uVar4 = *(undefined8 *)(pMVar19 + uVar16 * 8);
                *(undefined8 *)(pMVar19 + uVar16 * 8) = *(undefined8 *)(pMVar19 + uVar18 * 8);
                *(undefined8 *)(pMVar19 + uVar18 * 8) = uVar4;
                uVar18 = uVar16;
                goto joined_r0x00113f14;
              }
            }
            bVar22 = uVar7 != 0;
            uVar18 = uVar7 - 1;
            uVar7 = uVar18;
          } while (bVar22);
LAB_0011401f:
          if (uVar10 != 0) {
            uVar4 = *(undefined8 *)(pMVar19 + uVar10 * 8);
            *(undefined8 *)(pMVar19 + uVar10 * 8) = *(undefined8 *)pMVar19;
            *(undefined8 *)pMVar19 = uVar4;
            uVar10 = uVar10 - 1;
            uVar18 = 0;
            uVar7 = 0;
            do {
              if (uVar18 < uVar10) {
                if ((*(uint *)(pMVar19 + -4) <= uVar18) ||
                   (uVar15 = uVar18 | 1, *(uint *)(pMVar19 + -4) <= uVar15)) goto LAB_0011425f;
                if (*(ushort *)(pMVar19 + uVar15 * 8) <= *(ushort *)(pMVar19 + uVar18 * 8))
                goto LAB_00113fe1;
              }
              else {
LAB_00113fe1:
                uVar15 = uVar18;
              }
              if ((*(uint *)(pMVar19 + -4) <= uVar7) || (*(uint *)(pMVar19 + -4) <= uVar15))
              goto LAB_0011425f;
              if (*(ushort *)(pMVar19 + uVar15 * 8) <= *(ushort *)(pMVar19 + uVar7 * 8)) break;
              uVar4 = *(undefined8 *)(pMVar19 + uVar15 * 8);
              *(undefined8 *)(pMVar19 + uVar15 * 8) = *(undefined8 *)(pMVar19 + uVar7 * 8);
              *(undefined8 *)(pMVar19 + uVar7 * 8) = uVar4;
              uVar18 = uVar15 * 2;
              uVar7 = uVar15;
            } while (uVar18 <= uVar10);
            goto LAB_0011401f;
          }
        }
      }
      if (*(ushort *)(pMVar8 + -(long)*(int *)pMVar8) < 0x12) {
        uVar11 = 0;
      }
      else {
        uVar11 = *(ushort *)(pMVar8 + (0x10 - (long)*(int *)pMVar8));
      }
      if (uVar11 == 0) {
        pMVar19 = (MyGame_Example_Monster_mutable_table_t)0x0;
      }
      else {
        pMVar19 = pMVar8 + (ulong)*(uint *)(pMVar8 + uVar11) + (ulong)uVar11 + 4;
      }
      if (pMVar19 != (MyGame_Example_Monster_mutable_table_t)0x0) {
        uVar5 = *(uint *)(pMVar19 + -4);
        uVar10 = (ulong)uVar5;
        if (uVar10 != 0) {
          uVar18 = (ulong)(uVar5 >> 1);
          do {
            __flatbuffers_string__heap_sift_down
                      ((flatbuffers_string_mutable_vec_t)pMVar19,uVar18,uVar10 - 1);
            bVar22 = uVar18 != 0;
            uVar18 = uVar18 - 1;
          } while (bVar22);
          if (uVar10 - 1 != 0) {
            sVar21 = uVar10 - 2;
            iVar12 = uVar5 * -4;
            iVar17 = uVar5 * 4;
            do {
              iVar17 = iVar17 + -4;
              iVar12 = iVar12 + 4;
              iVar3 = *(int *)pMVar19;
              *(int *)pMVar19 = *(int *)(pMVar19 + sVar21 * 4 + 4) + iVar17;
              *(int *)(pMVar19 + sVar21 * 4 + 4) = iVar3 + iVar12;
              __flatbuffers_string__heap_sift_down
                        ((flatbuffers_string_mutable_vec_t)pMVar19,0,sVar21);
              bVar22 = sVar21 != 0;
              sVar21 = sVar21 - 1;
            } while (bVar22);
          }
        }
      }
      if (*(ushort *)(pMVar8 + -(long)*(int *)pMVar8) < 0x14) {
        uVar11 = 0;
      }
      else {
        uVar11 = *(ushort *)(pMVar8 + (0x12 - (long)*(int *)pMVar8));
      }
      if (uVar11 == 0) {
        pMVar8 = (MyGame_Example_Monster_mutable_table_t)0x0;
      }
      else {
        pMVar8 = pMVar8 + (ulong)*(uint *)(pMVar8 + uVar11) + (ulong)uVar11 + 4;
      }
      if (pMVar8 != (MyGame_Example_Monster_mutable_table_t)0x0) {
        uVar5 = *(uint *)(pMVar8 + -4);
        if ((ulong)uVar5 != 0) {
          uVar10 = (ulong)uVar5 - 1;
          uVar18 = (ulong)(uVar5 >> 1);
          uVar7 = uVar18;
joined_r0x00114134:
          do {
            uVar15 = uVar18 * 2;
            if (uVar15 <= uVar10) {
              if (uVar15 < uVar10) {
                if ((*(uint *)(pMVar8 + -4) <= uVar15) ||
                   (uVar16 = uVar15 | 1, *(uint *)(pMVar8 + -4) <= uVar16)) {
LAB_0011427e:
                  __assert_fail("flatbuffers_vec_len(vec__tmp) > (i__tmp) && \"index out of range\""
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O1/test/monster_test/generated/flatbuffers_common_reader.h"
                                ,0x1e0,
                                "float flatbuffers_float_vec_at(flatbuffers_float_vec_t, size_t)");
                }
                if (*(float *)(pMVar8 + (uVar18 << 3)) <= *(float *)(pMVar8 + uVar16 * 4) &&
                    *(float *)(pMVar8 + uVar16 * 4) != *(float *)(pMVar8 + (uVar18 << 3))) {
                  uVar15 = uVar16;
                }
              }
              if ((*(uint *)(pMVar8 + -4) <= uVar18) || (*(uint *)(pMVar8 + -4) <= uVar15))
              goto LAB_0011427e;
              fVar1 = *(float *)(pMVar8 + uVar15 * 4);
              if (*(float *)(pMVar8 + uVar18 * 4) < fVar1) {
                *(float *)(pMVar8 + uVar15 * 4) = *(float *)(pMVar8 + uVar18 * 4);
                *(float *)(pMVar8 + uVar18 * 4) = fVar1;
                uVar18 = uVar15;
                goto joined_r0x00114134;
              }
            }
            bVar22 = uVar7 != 0;
            uVar18 = uVar7 - 1;
            uVar7 = uVar18;
          } while (bVar22);
LAB_00114247:
          if (uVar10 != 0) {
            uVar2 = *(undefined4 *)(pMVar8 + uVar10 * 4);
            *(undefined4 *)(pMVar8 + uVar10 * 4) = *(undefined4 *)pMVar8;
            *(undefined4 *)pMVar8 = uVar2;
            uVar10 = uVar10 - 1;
            uVar18 = 0;
            uVar7 = 0;
            do {
              uVar15 = uVar18;
              if (uVar18 < uVar10) {
                if ((*(uint *)(pMVar8 + -4) <= uVar18) ||
                   (uVar16 = uVar18 | 1, *(uint *)(pMVar8 + -4) <= uVar16)) goto LAB_0011427e;
                if (*(float *)(pMVar8 + uVar18 * 4) <= *(float *)(pMVar8 + uVar16 * 4) &&
                    *(float *)(pMVar8 + uVar16 * 4) != *(float *)(pMVar8 + uVar18 * 4)) {
                  uVar15 = uVar16;
                }
              }
              if ((*(uint *)(pMVar8 + -4) <= uVar7) || (*(uint *)(pMVar8 + -4) <= uVar15))
              goto LAB_0011427e;
              fVar1 = *(float *)(pMVar8 + uVar15 * 4);
              if (fVar1 <= *(float *)(pMVar8 + uVar7 * 4)) break;
              *(float *)(pMVar8 + uVar15 * 4) = *(float *)(pMVar8 + uVar7 * 4);
              *(float *)(pMVar8 + uVar7 * 4) = fVar1;
              uVar18 = uVar15 * 2;
              uVar7 = uVar15;
            } while (uVar18 <= uVar10);
            goto LAB_00114247;
          }
        }
      }
    }
  }
  else if (u.type == '\x01') {
    MyGame_Example_Monster_sort(pMVar8);
    return;
  }
  return;
}

Assistant:

static void MyGame_Example_Any_sort(MyGame_Example_Any_mutable_union_t u)
{
    switch (u.type) {
    case MyGame_Example_Any_Monster: MyGame_Example_Monster_sort(u.value); break;
    case MyGame_Example_Any_Alt: MyGame_Example_Alt_sort(u.value); break;
    default: break;
    }
}